

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounded_utf8_length_sequence.h
# Opt level: O3

uint32_t __thiscall
absl::debugging_internal::BoundedUtf8LengthSequence<256U>::InsertAndReturnSumOfPredecessors
          (BoundedUtf8LengthSequence<256U> *this,uint32_t index,uint32_t utf8_length)

{
  ulong uVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  uint64_t *puVar6;
  uint uVar7;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  char cVar14;
  ushort uVar15;
  byte bVar26;
  byte bVar28;
  int iVar17;
  char cVar27;
  char cVar29;
  byte bVar33;
  int iVar30;
  byte bVar31;
  char cVar32;
  char cVar34;
  byte bVar35;
  undefined1 auVar24 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ulong uVar8;
  undefined4 uVar16;
  undefined6 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar25 [16];
  undefined1 auVar41 [14];
  undefined1 auVar42 [14];
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  
  uVar2 = 0xff;
  if (index < 0xff) {
    uVar2 = index;
  }
  bVar3 = (char)uVar2 * '\x02' & 0x3e;
  uVar9 = -1L << bVar3;
  uVar7 = uVar2 >> 5;
  uVar8 = (ulong)uVar7;
  uVar11 = ~uVar9;
  uVar10 = this->rep_[uVar8];
  uVar4 = uVar10 & uVar11;
  uVar12 = uVar4 & 0x2aaaaaaaaaaaaaaa;
  auVar36._0_2_ = (ushort)uVar4 >> 1;
  auVar36._2_2_ = (ushort)(uVar4 >> 0x10) >> 1;
  auVar36._4_2_ = (ushort)(uVar4 >> 0x20) >> 1;
  auVar36._6_2_ = (ushort)(uVar4 >> 0x31);
  auVar36._8_2_ = (ushort)uVar12 >> 1;
  auVar36._10_2_ = (ushort)(uVar12 >> 0x10) >> 1;
  auVar36._12_2_ = (ushort)(uVar12 >> 0x20) >> 1;
  auVar36._14_2_ = (ushort)(uVar12 >> 0x31);
  auVar36 = auVar36 & _DAT_001c96a0;
  uVar15 = CONCAT11((char)(uVar4 >> 8) - auVar36[1],(char)uVar4 - auVar36[0]);
  uVar16 = CONCAT13((char)(uVar4 >> 0x18) - auVar36[3],
                    CONCAT12((char)(uVar4 >> 0x10) - auVar36[2],uVar15));
  uVar18 = CONCAT15((char)(uVar4 >> 0x28) - auVar36[5],
                    CONCAT14((char)(uVar4 >> 0x20) - auVar36[4],uVar16));
  uVar19 = CONCAT17((char)(uVar4 >> 0x38) - auVar36[7],
                    CONCAT16((char)(uVar4 >> 0x30) - auVar36[6],uVar18));
  auVar20._0_10_ =
       CONCAT19((char)(uVar12 >> 8) - auVar36[9],CONCAT18((char)uVar12 - auVar36[8],uVar19));
  auVar20[10] = (char)(uVar12 >> 0x10) - auVar36[10];
  auVar20[0xb] = (char)(uVar12 >> 0x18) - auVar36[0xb];
  auVar22[0xc] = (char)(uVar12 >> 0x20) - auVar36[0xc];
  auVar22._0_12_ = auVar20;
  auVar22[0xd] = (char)(uVar12 >> 0x28) - auVar36[0xd];
  auVar38[0xe] = (char)(uVar12 >> 0x30) - auVar36[0xe];
  auVar38._0_14_ = auVar22;
  auVar38[0xf] = (char)(uVar12 >> 0x38) - auVar36[0xf];
  auVar36 = auVar38 & _DAT_001c96b0;
  auVar24._0_2_ = uVar15 >> 2;
  auVar24._2_2_ = (ushort)((uint)uVar16 >> 0x12);
  auVar24._4_2_ = (ushort)((uint6)uVar18 >> 0x22);
  auVar24._6_2_ = (ushort)((ulong)uVar19 >> 0x32);
  auVar24._8_2_ = (ushort)((unkuint10)auVar20._0_10_ >> 0x42);
  auVar24._10_2_ = auVar20._10_2_ >> 2;
  auVar24._12_2_ = auVar22._12_2_ >> 2;
  auVar24._14_2_ = auVar38._14_2_ >> 2;
  auVar24 = auVar24 & _DAT_001c96b0;
  cVar14 = auVar24[0] + auVar36[0];
  bVar26 = auVar24[1] + auVar36[1];
  uVar15 = CONCAT11(bVar26,cVar14);
  cVar27 = auVar24[2] + auVar36[2];
  bVar28 = auVar24[3] + auVar36[3];
  uVar16 = CONCAT13(bVar28,CONCAT12(cVar27,uVar15));
  cVar29 = auVar24[4] + auVar36[4];
  bVar31 = auVar24[5] + auVar36[5];
  uVar18 = CONCAT15(bVar31,CONCAT14(cVar29,uVar16));
  cVar32 = auVar24[6] + auVar36[6];
  bVar33 = auVar24[7] + auVar36[7];
  uVar19 = CONCAT17(bVar33,CONCAT16(cVar32,uVar18));
  cVar34 = auVar24[8] + auVar36[8];
  bVar35 = auVar24[9] + auVar36[9];
  auVar21._0_10_ = CONCAT19(bVar35,CONCAT18(cVar34,uVar19));
  auVar21[10] = auVar24[10] + auVar36[10];
  auVar21[0xb] = auVar24[0xb] + auVar36[0xb];
  auVar23[0xc] = auVar24[0xc] + auVar36[0xc];
  auVar23._0_12_ = auVar21;
  auVar23[0xd] = auVar24[0xd] + auVar36[0xd];
  auVar25[0xe] = auVar24[0xe] + auVar36[0xe];
  auVar25._0_14_ = auVar23;
  auVar25[0xf] = auVar24[0xf] + auVar36[0xf];
  auVar37[0] = (char)(uVar15 >> 4) + cVar14;
  auVar37[1] = (bVar26 >> 4) + bVar26;
  auVar37[2] = (char)(ushort)((uint)uVar16 >> 0x14) + cVar27;
  auVar37[3] = (bVar28 >> 4) + bVar28;
  auVar37[4] = (char)(ushort)((uint6)uVar18 >> 0x24) + cVar29;
  auVar37[5] = (bVar31 >> 4) + bVar31;
  auVar37[6] = (char)(ushort)((ulong)uVar19 >> 0x34) + cVar32;
  auVar37[7] = (bVar33 >> 4) + bVar33;
  auVar37[8] = (char)(ushort)((unkuint10)auVar21._0_10_ >> 0x44) + cVar34;
  auVar37[9] = (bVar35 >> 4) + bVar35;
  auVar37[10] = (char)(auVar21._10_2_ >> 4) + auVar21[10];
  auVar37[0xb] = (auVar21[0xb] >> 4) + auVar21[0xb];
  auVar37[0xc] = (char)(auVar23._12_2_ >> 4) + auVar23[0xc];
  auVar37[0xd] = (auVar23[0xd] >> 4) + auVar23[0xd];
  auVar37[0xe] = (char)(auVar25._14_2_ >> 4) + auVar25[0xe];
  auVar37[0xf] = (auVar25[0xf] >> 4) + auVar25[0xf];
  auVar38 = psadbw(auVar37 & _DAT_001c96c0,(undefined1  [16])0x0);
  iVar17 = auVar38._0_4_;
  iVar30 = auVar38._8_4_;
  if (0x1f < index) {
    puVar6 = this->rep_ + (uVar7 - 1);
    uVar12 = uVar8;
    do {
      uVar1 = *puVar6;
      uVar13 = uVar1 & 0xaaaaaaaaaaaaaaaa;
      puVar6 = puVar6 + -1;
      auVar46._0_2_ = (ushort)uVar1 >> 1;
      auVar46._2_2_ = (ushort)(uVar1 >> 0x10) >> 1;
      auVar46._4_2_ = (ushort)(uVar1 >> 0x20) >> 1;
      auVar46._6_2_ = (ushort)(uVar1 >> 0x31);
      auVar46._8_2_ = (ushort)uVar13 >> 1;
      auVar46._10_2_ = (ushort)(uVar13 >> 0x10) >> 1;
      auVar46._12_2_ = (ushort)(uVar13 >> 0x20) >> 1;
      auVar46._14_2_ = (ushort)(uVar13 >> 0x31);
      auVar46 = auVar46 & _DAT_001c96a0;
      uVar15 = CONCAT11((char)(uVar1 >> 8) - auVar46[1],(char)uVar1 - auVar46[0]);
      uVar16 = CONCAT13((char)(uVar1 >> 0x18) - auVar46[3],
                        CONCAT12((char)(uVar1 >> 0x10) - auVar46[2],uVar15));
      uVar18 = CONCAT15((char)(uVar1 >> 0x28) - auVar46[5],
                        CONCAT14((char)(uVar1 >> 0x20) - auVar46[4],uVar16));
      uVar19 = CONCAT17((char)(uVar1 >> 0x38) - auVar46[7],
                        CONCAT16((char)(uVar1 >> 0x30) - auVar46[6],uVar18));
      auVar39._0_10_ =
           CONCAT19((char)(uVar13 >> 8) - auVar46[9],CONCAT18((char)uVar13 - auVar46[8],uVar19));
      auVar39[10] = (char)(uVar13 >> 0x10) - auVar46[10];
      auVar39[0xb] = (char)(uVar13 >> 0x18) - auVar46[0xb];
      auVar41[0xc] = (char)(uVar13 >> 0x20) - auVar46[0xc];
      auVar41._0_12_ = auVar39;
      auVar41[0xd] = (char)(uVar13 >> 0x28) - auVar46[0xd];
      auVar43[0xe] = (char)(uVar13 >> 0x30) - auVar46[0xe];
      auVar43._0_14_ = auVar41;
      auVar43[0xf] = (char)(uVar13 >> 0x38) - auVar46[0xf];
      auVar38 = auVar43 & _DAT_001c96b0;
      auVar44._0_2_ = uVar15 >> 2;
      auVar44._2_2_ = (ushort)((uint)uVar16 >> 0x12);
      auVar44._4_2_ = (ushort)((uint6)uVar18 >> 0x22);
      auVar44._6_2_ = (ushort)((ulong)uVar19 >> 0x32);
      auVar44._8_2_ = (ushort)((unkuint10)auVar39._0_10_ >> 0x42);
      auVar44._10_2_ = auVar39._10_2_ >> 2;
      auVar44._12_2_ = auVar41._12_2_ >> 2;
      auVar44._14_2_ = auVar43._14_2_ >> 2;
      auVar44 = auVar44 & _DAT_001c96b0;
      cVar14 = auVar44[0] + auVar38[0];
      bVar26 = auVar44[1] + auVar38[1];
      uVar15 = CONCAT11(bVar26,cVar14);
      cVar27 = auVar44[2] + auVar38[2];
      bVar28 = auVar44[3] + auVar38[3];
      uVar16 = CONCAT13(bVar28,CONCAT12(cVar27,uVar15));
      cVar29 = auVar44[4] + auVar38[4];
      bVar31 = auVar44[5] + auVar38[5];
      uVar18 = CONCAT15(bVar31,CONCAT14(cVar29,uVar16));
      cVar32 = auVar44[6] + auVar38[6];
      bVar33 = auVar44[7] + auVar38[7];
      uVar19 = CONCAT17(bVar33,CONCAT16(cVar32,uVar18));
      cVar34 = auVar44[8] + auVar38[8];
      bVar35 = auVar44[9] + auVar38[9];
      auVar40._0_10_ = CONCAT19(bVar35,CONCAT18(cVar34,uVar19));
      auVar40[10] = auVar44[10] + auVar38[10];
      auVar40[0xb] = auVar44[0xb] + auVar38[0xb];
      auVar42[0xc] = auVar44[0xc] + auVar38[0xc];
      auVar42._0_12_ = auVar40;
      auVar42[0xd] = auVar44[0xd] + auVar38[0xd];
      auVar45[0xe] = auVar44[0xe] + auVar38[0xe];
      auVar45._0_14_ = auVar42;
      auVar45[0xf] = auVar44[0xf] + auVar38[0xf];
      auVar47[0] = (char)(uVar15 >> 4) + cVar14;
      auVar47[1] = (bVar26 >> 4) + bVar26;
      auVar47[2] = (char)(ushort)((uint)uVar16 >> 0x14) + cVar27;
      auVar47[3] = (bVar28 >> 4) + bVar28;
      auVar47[4] = (char)(ushort)((uint6)uVar18 >> 0x24) + cVar29;
      auVar47[5] = (bVar31 >> 4) + bVar31;
      auVar47[6] = (char)(ushort)((ulong)uVar19 >> 0x34) + cVar32;
      auVar47[7] = (bVar33 >> 4) + bVar33;
      auVar47[8] = (char)(ushort)((unkuint10)auVar40._0_10_ >> 0x44) + cVar34;
      auVar47[9] = (bVar35 >> 4) + bVar35;
      auVar47[10] = (char)(auVar40._10_2_ >> 4) + auVar40[10];
      auVar47[0xb] = (auVar40[0xb] >> 4) + auVar40[0xb];
      auVar47[0xc] = (char)(auVar42._12_2_ >> 4) + auVar42[0xc];
      auVar47[0xd] = (auVar42[0xd] >> 4) + auVar42[0xd];
      auVar47[0xe] = (char)(auVar45._14_2_ >> 4) + auVar45[0xe];
      auVar47[0xf] = (auVar45[0xf] >> 4) + auVar45[0xf];
      auVar38 = psadbw(auVar47 & _DAT_001c96c0,(undefined1  [16])0x0);
      iVar17 = iVar17 + auVar38._0_4_;
      iVar30 = iVar30 + auVar38._8_4_;
      uVar5 = (int)uVar12 - 1;
      uVar12 = (ulong)uVar5;
    } while (uVar5 != 0);
  }
  if (uVar7 != 7) {
    uVar10 = 7;
    uVar4 = this->rep_[7];
    do {
      uVar12 = this->rep_[uVar10 - 1];
      this->rep_[uVar10] = uVar4 << 2 | uVar12 >> 0x3e;
      uVar10 = uVar10 - 1;
      uVar4 = uVar12;
    } while (uVar8 < uVar10);
    uVar10 = this->rep_[uVar8];
    uVar4 = uVar11 & uVar10;
  }
  uVar11 = 0;
  if (0xfffffffb < utf8_length - 5) {
    uVar11 = (ulong)(utf8_length - 1);
  }
  this->rep_[uVar8] = (uVar10 & uVar9) << 2 | uVar11 << bVar3 | uVar4;
  return iVar30 + iVar17 + uVar2;
}

Assistant:

uint32_t InsertAndReturnSumOfPredecessors(
      uint32_t index, uint32_t utf8_length) {
    // The caller shouldn't pass out-of-bounds inputs, but if it does happen,
    // clamp the values and try to continue.  If we're being called from a
    // signal handler, the last thing we want to do is crash.  Emitting
    // malformed UTF-8 is a lesser evil.
    if (index >= max_elements) index = max_elements - 1;
    if (utf8_length == 0 || utf8_length > 4) utf8_length = 1;

    const uint32_t word_index = index/32;
    const uint32_t bit_index = 2 * (index % 32);
    const uint64_t ones_bit = uint64_t{1} << bit_index;

    // Compute the sum of predecessors.
    //   - Each value from 1 to 4 is represented by a bit field with value from
    //     0 to 3, so the desired sum is index plus the sum of the
    //     representations actually stored.
    //   - For each bit field, a set low bit should contribute 1 to the sum, and
    //     a set high bit should contribute 2.
    //   - Another way to say the same thing is that each set bit contributes 1,
    //     and each set high bit contributes an additional 1.
    //   - So the sum we want is index + popcount(everything) + popcount(bits in
    //     odd positions).
    const uint64_t odd_bits_mask = 0xaaaaaaaaaaaaaaaa;
    const uint64_t lower_seminibbles_mask = ones_bit - 1;
    const uint64_t higher_seminibbles_mask = ~lower_seminibbles_mask;
    const uint64_t same_word_bits_below_insertion =
        rep_[word_index] & lower_seminibbles_mask;
    int full_popcount = absl::popcount(same_word_bits_below_insertion);
    int odd_popcount =
        absl::popcount(same_word_bits_below_insertion & odd_bits_mask);
    for (uint32_t j = word_index; j > 0; --j) {
      const uint64_t word_below_insertion = rep_[j - 1];
      full_popcount += absl::popcount(word_below_insertion);
      odd_popcount += absl::popcount(word_below_insertion & odd_bits_mask);
    }
    const uint32_t sum_of_predecessors =
        index + static_cast<uint32_t>(full_popcount + odd_popcount);

    // Now insert utf8_length's representation, shifting successors up one
    // place.
    for (uint32_t j = max_elements/32 - 1; j > word_index; --j) {
      rep_[j] = (rep_[j] << 2) | (rep_[j - 1] >> 62);
    }
    rep_[word_index] =
        (rep_[word_index] & lower_seminibbles_mask) |
        (uint64_t{utf8_length - 1} << bit_index) |
        ((rep_[word_index] & higher_seminibbles_mask) << 2);

    return sum_of_predecessors;
  }